

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetTexViewTypeLiteralName(TEXTURE_VIEW_TYPE ViewType)

{
  int iVar1;
  Char *pCVar2;
  TEXTURE_VIEW_TYPE ViewType_local;
  
  if (GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::TexViewTypeToLiteralName == '\0') {
    iVar1 = __cxa_guard_acquire(&GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::
                                 TexViewTypeToLiteralName);
    if (iVar1 != 0) {
      GetTexViewTypeLiteralName::TexViewTypeToLiteralNameMap::TexViewTypeToLiteralNameMap
                (&GetTexViewTypeLiteralName::TexViewTypeToLiteralName);
      __cxa_guard_release(&GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::
                           TexViewTypeToLiteralName);
    }
  }
  pCVar2 = GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::TexViewTypeToLiteralNameMap::
           operator[](Diligent::TEXTURE_VIEW_TYPE__const
                     (&GetTexViewTypeLiteralName::TexViewTypeToLiteralName,ViewType);
  return pCVar2;
}

Assistant:

const Char* GetTexViewTypeLiteralName(TEXTURE_VIEW_TYPE ViewType)
{
    struct TexViewTypeToLiteralNameMap
    {
        TexViewTypeToLiteralNameMap()
        {
#define INIT_TEX_VIEW_TYPE_NAME(ViewType) TexViewLiteralNames[ViewType] = #ViewType
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNDEFINED);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADER_RESOURCE);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_RENDER_TARGET);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNORDERED_ACCESS);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADING_RATE);
#undef INIT_TEX_VIEW_TYPE_NAME
            static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Not all texture views names are initialized.");
        }

        const Char* operator[](TEXTURE_VIEW_TYPE ViewType) const
        {
            if (ViewType >= TEXTURE_VIEW_UNDEFINED && ViewType < TEXTURE_VIEW_NUM_VIEWS)
            {
                return TexViewLiteralNames[ViewType];
            }
            else
            {
                UNEXPECTED("Texture view type (", static_cast<Uint32>(ViewType), ") is out of allowed range [0, ", static_cast<Uint32>(TEXTURE_VIEW_NUM_VIEWS) - 1, "]");
                return "<Unknown texture view type>";
            }
        }

    private:
        std::array<const Char*, TEXTURE_VIEW_NUM_VIEWS> TexViewLiteralNames{};
    };

    static const TexViewTypeToLiteralNameMap TexViewTypeToLiteralName;
    return TexViewTypeToLiteralName[ViewType];
}